

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

void __thiscall
proto2_unittest::TestAllTypes::set_allocated_optional_string(TestAllTypes *this,string *value)

{
  uint32_t *puVar1;
  Arena *arena;
  string *value_local;
  TestAllTypes *this_local;
  
  if (value == (string *)0x0) {
    puVar1 = google::protobuf::internal::HasBits<2>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  else {
    puVar1 = google::protobuf::internal::HasBits<2>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar1 = *puVar1 | 1;
  }
  arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  google::protobuf::internal::ArenaStringPtr::SetAllocated
            (&(this->field_0)._impl_.optional_string_,value,arena);
  return;
}

Assistant:

inline void TestAllTypes::set_allocated_optional_string(::std::string* PROTOBUF_NULLABLE value) {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (value != nullptr) {
    _impl_._has_bits_[0] |= 0x00000001u;
  } else {
    _impl_._has_bits_[0] &= ~0x00000001u;
  }
  _impl_.optional_string_.SetAllocated(value, GetArena());
  if (::google::protobuf::internal::DebugHardenForceCopyDefaultString() && _impl_.optional_string_.IsDefault()) {
    _impl_.optional_string_.Set("", GetArena());
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestAllTypes.optional_string)
}